

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_basis.h
# Opt level: O1

void __thiscall
ktx::OptionsEncodeBasis<true>::captureCodecOption(OptionsEncodeBasis<true> *this,char *name)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string local_48;
  char *local_28 [3];
  
  fmt.size_ = 0xc;
  fmt.data_ = (char *)0x5;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_28;
  local_28[0] = name;
  ::fmt::v10::vformat_abi_cxx11_(&local_48,(v10 *)0x20a138,fmt,args);
  std::__cxx11::string::_M_append((char *)&this->codecOptions,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void captureCodecOption(const char* name) {
        codecOptions += fmt::format(" --{}", name);
    }